

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  reference proxy;
  curl_off_t size;
  char *filename;
  _Map_pointer *this;
  reference ppTVar2;
  _Self *__y;
  Task **task;
  iterator __end1;
  iterator __begin1;
  list<Task_*,_std::allocator<Task_*>_> *__range1;
  curl_off_t file_length;
  argument args;
  undefined1 local_e8 [8];
  download_status Status;
  char **argv_local;
  int argc_local;
  
  Status.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)argv;
  curl_global_init(3);
  std::queue<Task*,std::deque<Task*,std::allocator<Task*>>>::
  queue<std::deque<Task*,std::allocator<Task*>>,void>
            ((queue<Task*,std::deque<Task*,std::allocator<Task*>>> *)local_e8);
  Status.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  Status.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  Status.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::list
            ((list<Task_*,_std::allocator<Task_*>_> *)
             ((long)&Status.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>.
                     _M_impl.super__Deque_impl_data._M_finish + 0x18));
  Status.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node._M_size =
       0;
  Status.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  Status.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  std::__cxx11::list<proxy,_std::allocator<proxy>_>::list
            ((list<proxy,_std::allocator<proxy>_> *)
             &Status.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl.
              _M_node._M_size);
  std::queue<proxy,std::deque<proxy,std::allocator<proxy>>>::
  queue<std::deque<proxy,std::allocator<proxy>>,void>
            ((queue<proxy,std::deque<proxy,std::allocator<proxy>>> *)
             &Status.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node
              ._M_size);
  parser((argument *)&file_length,argc,
         (char **)Status.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
  initialize_proxy_list((char **)file_length,(int)args.proxy_list,(download_status *)local_e8);
  proxy = std::__cxx11::list<proxy,_std::allocator<proxy>_>::front
                    ((list<proxy,_std::allocator<proxy>_> *)
                     &Status.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>.
                      _M_impl._M_node._M_size);
  size = get_file_size((string *)&args.proxy_count,&proxy->address);
  filename = (char *)std::__cxx11::string::c_str();
  create_file(filename,size);
  initialize_task_list
            ((string *)&args.field_0x28,(string *)&args.proxy_count,size,(download_status *)local_e8
            );
  start_progress_thread(size,(download_status *)local_e8);
  message_loop((string *)&args.field_0x28,(string *)&args.proxy_count,size,
               (download_status *)local_e8);
  this = (_Map_pointer *)
         ((long)&Status.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish + 0x18);
  __end1 = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::begin
                     ((list<Task_*,_std::allocator<Task_*>_> *)this);
  task = (Task **)std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::end
                            ((list<Task_*,_std::allocator<Task_*>_> *)this);
  while( true ) {
    __y = (_Self *)&task;
    bVar1 = std::operator!=(&__end1,__y);
    if (!bVar1) break;
    ppTVar2 = std::_List_iterator<Task_*>::operator*(&__end1);
    Task::wait(*ppTVar2,__y);
    std::_List_iterator<Task_*>::operator++(&__end1);
  }
  curl_global_cleanup();
  argument::~argument((argument *)&file_length);
  download_status::~download_status((download_status *)local_e8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    curl_global_init(CURL_GLOBAL_ALL);
    download_status Status{};// Status是全局的，包含当前下载的所有状态
    argument args = parser(argc, argv);
    initialize_proxy_list(args.proxy_list, args.proxy_count, &Status);
    curl_off_t file_length = get_file_size(args.download_address, Status.globalProxyList.front().address);
    create_file(args.file_name.c_str(), file_length);
    initialize_task_list(args.file_name, args.download_address, file_length, &Status);
    start_progress_thread(file_length, &Status);
    message_loop(args.file_name, args.download_address, file_length, &Status);
    for (Task *&task:Status.globalTaskList) {
        (*task).wait();
    }
    curl_global_cleanup();
}